

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

bool __thiscall TlbExport::save(TlbExport *this,ostream *stream,RegistryIterator *type)

{
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  undefined8 uVar4;
  TlbExportVisitor exporter;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  bVar2 = Typelib::RegistryIterator::isAlias(type);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"  <alias name=\"",0xf);
    lVar1 = *(long *)(*(long *)(type + 8) + 0x20);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,lVar1,*(long *)(*(long *)(type + 8) + 0x28) + lVar1);
    anon_unknown.dwarf_5450::xmlEscape((string *)local_a0,&local_c0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(char *)local_a0._0_8_,local_a0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" source=\"",10);
    Typelib::Type::getName_abi_cxx11_();
    anon_unknown.dwarf_5450::xmlEscape(&local_e0,&local_50);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_e0._M_dataplus._M_p,local_e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"/>\n",4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_);
    }
    uVar4 = local_c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
      return true;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"  ",2);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"  ","");
    lVar1 = *(long *)(*(long *)(type + 8) + 0x50);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,lVar1,*(long *)(*(long *)(type + 8) + 0x58) + lVar1);
    local_a0._0_8_ = &PTR_visit__00113670;
    local_90._M_allocated_capacity = (size_type)&local_80;
    local_a0._8_8_ = stream;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_a0 + 0x10),local_c0._M_dataplus._M_p,
               local_c0._M_dataplus._M_p + local_c0._M_string_length);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,local_e0._M_dataplus._M_p,
               local_e0._M_dataplus._M_p + local_e0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    Typelib::TypeVisitor::apply((Type *)local_a0);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    local_a0._0_8_ = &PTR_visit__00113670;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    uVar4 = local_90._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_allocated_capacity == &local_80) {
      return true;
    }
  }
  operator_delete((void *)uVar4);
  return true;
}

Assistant:

bool TlbExport::save
    ( ostream& stream
    , Typelib::RegistryIterator const& type )
{
    if (type.isAlias())
    {
        stream << "  <alias "
            "name=\"" << xmlEscape(type.getName()) << "\" "
            "source=\"" << xmlEscape(type->getName()) << "\"/>\n";
    }
    else
    {
        stream << "  ";
        TlbExportVisitor exporter(stream, "  ", type.getSource());
        exporter.apply(*type);
        stream << "\n";
    }
    return true;
}